

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t sVar1;
  byte *pbVar2;
  int iVar3;
  TString *pTVar4;
  bool bVar5;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_4c;
  uint local_48;
  uint local_44;
  int c;
  TString *ts;
  int sep_1;
  int sep;
  SemInfo *seminfo_local;
  LexState *ls_local;
  
  ls->buff->n = 0;
  do {
    switch(ls->current) {
    default:
      if ((""[ls->current + 1] & 1) == 0) {
        iVar3 = ls->current;
        sVar1 = ls->z->n;
        ls->z->n = sVar1 - 1;
        if (sVar1 == 0) {
          local_88 = luaZ_fill(ls->z);
        }
        else {
          pbVar2 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar2 + 1);
          local_88 = (uint)*pbVar2;
        }
        ls->current = local_88;
        return iVar3;
      }
      do {
        save(ls,ls->current);
        sVar1 = ls->z->n;
        ls->z->n = sVar1 - 1;
        if (sVar1 == 0) {
          local_84 = luaZ_fill(ls->z);
        }
        else {
          pbVar2 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar2 + 1);
          local_84 = (uint)*pbVar2;
        }
        ls->current = local_84;
      } while ((""[ls->current + 1] & 3) != 0);
      pTVar4 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
      seminfo->ts = pTVar4;
      if (((pTVar4->tsv).tt == '\x04') && ((pTVar4->tsv).extra != '\0')) {
        return (pTVar4->tsv).extra + 0x100;
      }
      return 0x120;
    case 9:
    case 0xb:
    case 0xc:
    case 0x20:
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_44 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_44 = (uint)*pbVar2;
      }
      ls->current = local_44;
      break;
    case 10:
    case 0xd:
      inclinenumber(ls);
      break;
    case 0x22:
    case 0x27:
      read_string(ls,ls->current,seminfo);
      return 0x121;
    case 0x2d:
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_48 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_48 = (uint)*pbVar2;
      }
      ls->current = local_48;
      if (ls->current != 0x2d) {
        return 0x2d;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_4c = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_4c = (uint)*pbVar2;
      }
      ls->current = local_4c;
      if (ls->current == 0x5b) {
        iVar3 = skip_sep(ls);
        ls->buff->n = 0;
        if (iVar3 < 0) goto LAB_00110f93;
        read_long_string(ls,(SemInfo *)0x0,iVar3);
        ls->buff->n = 0;
      }
      else {
LAB_00110f93:
        while( true ) {
          bVar5 = false;
          if ((ls->current != 10) && (bVar5 = false, ls->current != 0xd)) {
            bVar5 = ls->current != -1;
          }
          if (!bVar5) break;
          sVar1 = ls->z->n;
          ls->z->n = sVar1 - 1;
          if (sVar1 == 0) {
            local_54 = luaZ_fill(ls->z);
          }
          else {
            pbVar2 = (byte *)ls->z->p;
            ls->z->p = (char *)(pbVar2 + 1);
            local_54 = (uint)*pbVar2;
          }
          ls->current = local_54;
        }
      }
      break;
    case 0x2e:
      save(ls,ls->current);
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_80 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_80 = (uint)*pbVar2;
      }
      ls->current = local_80;
      iVar3 = check_next(ls,".");
      if (iVar3 != 0) {
        iVar3 = check_next(ls,".");
        if (iVar3 != 0) {
          return 0x118;
        }
        return 0x117;
      }
      if ((""[ls->current + 1] & 2) == 0) {
        return 0x2e;
      }
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      read_numeral(ls,seminfo);
      return 0x11f;
    case 0x3a:
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_78 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_78 = (uint)*pbVar2;
      }
      ls->current = local_78;
      if (ls->current != 0x3a) {
        return 0x3a;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_7c = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_7c = (uint)*pbVar2;
      }
      ls->current = local_7c;
      return 0x11d;
    case 0x3c:
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_60 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_60 = (uint)*pbVar2;
      }
      ls->current = local_60;
      if (ls->current != 0x3d) {
        return 0x3c;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_64 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_64 = (uint)*pbVar2;
      }
      ls->current = local_64;
      return 0x11b;
    case 0x3d:
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_58 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_58 = (uint)*pbVar2;
      }
      ls->current = local_58;
      if (ls->current != 0x3d) {
        return 0x3d;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_5c = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_5c = (uint)*pbVar2;
      }
      ls->current = local_5c;
      return 0x119;
    case 0x3e:
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_68 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_68 = (uint)*pbVar2;
      }
      ls->current = local_68;
      if (ls->current != 0x3d) {
        return 0x3e;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_6c = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_6c = (uint)*pbVar2;
      }
      ls->current = local_6c;
      return 0x11a;
    case 0x5b:
      iVar3 = skip_sep(ls);
      if (-1 < iVar3) {
        read_long_string(ls,seminfo,iVar3);
        return 0x121;
      }
      if (iVar3 == -1) {
        return 0x5b;
      }
      lexerror(ls,"invalid long string delimiter",0x121);
    case 0x7e:
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_70 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_70 = (uint)*pbVar2;
      }
      ls->current = local_70;
      if (ls->current != 0x3d) {
        return 0x7e;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_74 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_74 = (uint)*pbVar2;
      }
      ls->current = local_74;
      return 0x11c;
    case -1:
      return 0x11e;
    }
  } while( true );
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          int sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* `skip_sep' may dirty the buffer */
          if (sep >= 0) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        int sep = skip_sep(ls);
        if (sep >= 0) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep == -1) return '[';
        else lexerror(ls, "invalid long string delimiter", TK_STRING);
      }
      case '=': {
        next(ls);
        if (ls->current != '=') return '=';
        else { next(ls); return TK_EQ; }
      }
      case '<': {
        next(ls);
        if (ls->current != '=') return '<';
        else { next(ls); return TK_LE; }
      }
      case '>': {
        next(ls);
        if (ls->current != '=') return '>';
        else { next(ls); return TK_GE; }
      }
      case '~': {
        next(ls);
        if (ls->current != '=') return '~';
        else { next(ls); return TK_NE; }
      }
      case ':': {
        next(ls);
        if (ls->current != ':') return ':';
        else { next(ls); return TK_DBCOLON; }
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next(ls, ".")) {
          if (check_next(ls, "."))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        /* else go through */
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        read_numeral(ls, seminfo);
        return TK_NUMBER;
      }
      case EOZ: {
        return TK_EOS;
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->tsv.extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens (+ - / ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}